

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymer.cpp
# Opt level: O3

void __thiscall Polymer::Bind(Polymer *this,Ptr *pol,string *promoter_name)

{
  int iVar1;
  size_type sVar2;
  bool bVar3;
  int iVar4;
  SpeciesTracker *pSVar5;
  long *plVar6;
  runtime_error *this_00;
  _func_int **pp_Var7;
  element_type *peVar8;
  byte bVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  _Alloc_hider _Var11;
  Ptr elem;
  vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  results;
  undefined1 local_c0 [40];
  element_type *local_98;
  _Base_ptr local_90;
  undefined1 local_88 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  iVar4 = std::__cxx11::string::compare((char *)promoter_name);
  if (iVar4 == 0) {
    peVar8 = (pol->super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    peVar8->start_ = 1;
    iVar4 = peVar8->footprint_;
    peVar8->stop_ = iVar4;
    peVar8->reading_frame_ = 1;
  }
  else {
    local_88._0_8_ = (pol->super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_88._8_8_ =
         (pol->super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_)->_M_use_count + 1;
      }
    }
    FindBindingSite((Polymer *)local_c0,(Ptr *)this,(string *)local_88);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
    }
    peVar8 = (pol->super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    iVar4 = *(int *)(local_c0._0_8_ + 0x38);
    peVar8->start_ = iVar4;
    peVar8->stop_ = iVar4 + -1 + peVar8->footprint_;
    peVar8->reading_frame_ = *(int *)(local_c0._0_8_ + 0x98);
    iVar4 = std::__cxx11::string::compare((char *)&peVar8->name_);
    if (iVar4 == 0) {
      peVar8 = (pol->super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_50,*(_func_int **)(local_c0._0_8_ + 0x70),
                 *(_func_int **)(local_c0._0_8_ + 0x78) +
                 (long)*(_func_int **)(local_c0._0_8_ + 0x70));
      std::__cxx11::string::_M_assign((string *)&peVar8->gene_bound_);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
    }
    if ((element_type *)local_c0._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0._8_8_);
    }
    peVar8 = (pol->super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    iVar4 = peVar8->stop_;
  }
  if (iVar4 < (this->mask_).super_MobileElement.start_) {
    local_78._M_dataplus._M_p = (pointer)0x0;
    local_78._M_string_length = 0;
    local_78.field_2._M_allocated_capacity = 0;
    local_c0._32_8_ = this;
    IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>::findOverlapping
              (&this->binding_sites_,(long)peVar8->start_,(long)iVar4,
               (intervalVector *)(local_88 + 0x10));
    sVar2 = local_78._M_string_length;
    if (local_78._M_dataplus._M_p != (pointer)local_78._M_string_length) {
      _Var11._M_p = local_78._M_dataplus._M_p;
      do {
        p_Var10 = (((element_type *)_Var11._M_p)->super_Reaction).
                  super_enable_shared_from_this<Reaction>._M_weak_this.
                  super___weak_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        iVar1 = *(int *)&p_Var10[9]._vptr__Sp_counted_base;
        iVar4 = iVar1 + 1;
        *(int *)&p_Var10[9]._vptr__Sp_counted_base = iVar4;
        if (-1 < iVar1 && *(int *)((long)&p_Var10[9]._vptr__Sp_counted_base + 4) == 0) {
          LogCover((Polymer *)local_c0._32_8_,(string *)&p_Var10[1]._M_use_count);
          p_Var10 = (((element_type *)_Var11._M_p)->super_Reaction).
                    super_enable_shared_from_this<Reaction>._M_weak_this.
                    super___weak_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
          iVar4 = *(int *)&p_Var10[9]._vptr__Sp_counted_base;
        }
        *(int *)((long)&p_Var10[9]._vptr__Sp_counted_base + 4) = iVar4;
        iVar4 = std::__cxx11::string::compare
                          ((char *)&((pol->
                                     super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>).
                                    _M_ptr)->name_);
        if (iVar4 != 0) {
          p_Var10 = (((element_type *)_Var11._M_p)->super_Reaction).
                    super_enable_shared_from_this<Reaction>._M_weak_this.
                    super___weak_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
          local_c0._0_8_ = local_c0 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"__ribosome","");
          bVar3 = BindingSite::CheckInteraction((BindingSite *)p_Var10,(string *)local_c0);
          if ((undefined1 *)local_c0._0_8_ != local_c0 + 0x10) {
            operator_delete((void *)local_c0._0_8_);
          }
          if (bVar3) {
            pSVar5 = SpeciesTracker::Instance();
            SpeciesTracker::IncrementRibo
                      (pSVar5,(string *)
                              ((((element_type *)_Var11._M_p)->super_Reaction).
                               super_enable_shared_from_this<Reaction>._M_weak_this.
                               super___weak_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                               _M_pi + 7),1);
          }
        }
        iVar4 = std::__cxx11::string::compare
                          ((char *)&((pol->
                                     super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>).
                                    _M_ptr)->name_);
        if (iVar4 == 0) {
          p_Var10 = (((element_type *)_Var11._M_p)->super_Reaction).
                    super_enable_shared_from_this<Reaction>._M_weak_this.
                    super___weak_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
          local_c0._0_8_ = local_c0 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"__ribosome","");
          bVar3 = BindingSite::CheckInteraction((BindingSite *)p_Var10,(string *)local_c0);
          if (bVar3) {
            bVar9 = *(byte *)((long)&(((element_type *)_Var11._M_p)->super_Reaction).
                                     super_enable_shared_from_this<Reaction>._M_weak_this.
                                     super___weak_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_refcount._M_pi[9]._M_weak_count + 1) ^ 1;
          }
          else {
            bVar9 = 0;
          }
          if ((undefined1 *)local_c0._0_8_ != local_c0 + 0x10) {
            operator_delete((void *)local_c0._0_8_);
          }
          if (bVar9 != 0) {
            p_Var10 = (((element_type *)_Var11._M_p)->super_Reaction).
                      super_enable_shared_from_this<Reaction>._M_weak_this.
                      super___weak_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
            if (*(bool *)&p_Var10[9]._M_weak_count == true) {
              pSVar5 = SpeciesTracker::Instance();
              SpeciesTracker::IncrementTranscript
                        (pSVar5,(string *)
                                ((((element_type *)_Var11._M_p)->super_Reaction).
                                 super_enable_shared_from_this<Reaction>._M_weak_this.
                                 super___weak_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                                 _M_pi + 7),-1);
              p_Var10 = (((element_type *)_Var11._M_p)->super_Reaction).
                        super_enable_shared_from_this<Reaction>._M_weak_this.
                        super___weak_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
            }
            BindingSite::Degrade((BindingSite *)p_Var10);
          }
        }
        _Var11._M_p = (pointer)&(((element_type *)_Var11._M_p)->super_Reaction).old_prop_;
      } while (_Var11._M_p != (pointer)sVar2);
    }
    local_98 = (pol->super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_90 = (_Base_ptr)
               (pol->super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
               _M_pi;
    if (local_90 != (_Base_ptr)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&local_90->_M_parent = *(int *)&local_90->_M_parent + 1;
        UNLOCK();
      }
      else {
        *(int *)&local_90->_M_parent = *(int *)&local_90->_M_parent + 1;
      }
    }
    (*(*(_func_int ***)local_c0._32_8_)[3])(local_c0._32_8_,&local_98);
    if (local_90 != (_Base_ptr)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90);
    }
    std::
    vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
    ::~vector((vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
               *)(local_88 + 0x10));
    return;
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_88 + 0x10),"MobileElement ",&peVar8->name_);
  plVar6 = (long *)std::__cxx11::string::append((char *)(local_88 + 0x10));
  local_c0._0_8_ = *plVar6;
  pp_Var7 = (_func_int **)(plVar6 + 2);
  if ((_func_int **)local_c0._0_8_ == pp_Var7) {
    local_c0._16_8_ = *pp_Var7;
    local_c0._24_8_ = plVar6[3];
    local_c0._0_8_ = local_c0 + 0x10;
  }
  else {
    local_c0._16_8_ = *pp_Var7;
  }
  local_c0._8_8_ = plVar6[1];
  *plVar6 = (long)pp_Var7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,(string *)local_c0);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Polymer::Bind(MobileElement::Ptr pol, const std::string &promoter_name) {
  // Find a free promoter to bind to
  if (promoter_name == "readthrough") {
    pol->start(1);
    pol->stop(pol->footprint());
    pol->reading_frame(1);
  } else {
    auto elem = FindBindingSite(pol, promoter_name);
    // Update polymerase coordinates
    // (TODO: refactor; pol doesn't need to expose footprint/stop position)
    pol->start(elem->start());
    pol->stop(elem->start() + pol->footprint() - 1);
    pol->reading_frame(elem->reading_frame());
    // Only set gene_bound_ for transcripts and ribosomesinit
    if (pol->name() == "__ribosome") {
      pol->gene_bound(elem->gene());
    }
  }
  // More error checking.
  if (pol->stop() >= mask_.start()) {
    std::string err = "MobileElement " + pol->name() +
                      " will overlap with mask upon promoter binding. This may "
                      "cause the polymerase to stall and produce unexpected "
                      "behavior.";
    throw std::runtime_error(err);
  }
  std::vector<Interval<BindingSite::Ptr>> results;
  binding_sites_.findOverlapping(pol->start(), pol->stop(), results);
  for (auto &interval : results) {
    interval.value->Cover();
    if (interval.value->WasCovered()) {
      // Cover promoter in cache
      LogCover(interval.value->name());
    }
    interval.value->ResetState();
    // Report some data to tracker
    if (pol->name() != "__rnase" &&
        interval.value->CheckInteraction("__ribosome")) {
      auto &tracker = SpeciesTracker::Instance();
      tracker.IncrementRibo(interval.value->gene(), 1);
    }
    if (pol->name() == "__rnase" &&
        interval.value->CheckInteraction("__ribosome") &&
        interval.value->degraded() == false) {
      // Only decrement transcript count if this binding site has
      // been exposed and logged by SpeciesTracker before
      if (interval.value->first_exposure() == true) {
        auto &tracker = SpeciesTracker::Instance();
        tracker.IncrementTranscript(interval.value->gene(), -1);
      }
      interval.value->Degrade();
    }
  }
  // Add polymerase to this polymer
  Attach(pol);
}